

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

void __thiscall wasm::BranchUtils::BranchTargets::Inner::Inner(Inner *this)

{
  Inner *this_local;
  
  PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  ::PostWalker(&this->
                super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
              );
  std::
  map<wasm::Name,_wasm::Expression_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Expression_*>_>_>
  ::map(&this->targets);
  std::
  map<wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  ::map(&this->branches);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      operateOnScopeNameDefs(curr, [&](Name name) {
        if (name.is()) {
          targets[name] = curr;
        }
      });
      operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          branches[name].insert(curr);
        }
      });
    }